

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.cpp
# Opt level: O0

int __thiscall CaDiCaL::Internal::backward_true_satisfiable(Internal *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  Internal *in_RDI;
  int idx;
  Internal *in_stack_00000110;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar3 = in_RDI->max_var;
  while( true ) {
    if (iVar3 < 1) {
      if (in_RDI->internal != (Internal *)0x0) {
        verbose(in_RDI->internal,1,"backward assuming variables true satisfies formula");
      }
      (in_RDI->stats).lucky.backward.one = (in_RDI->stats).lucky.backward.one + 1;
      return 10;
    }
    bVar1 = terminated_asynchronously
                      ((Internal *)CONCAT44(iVar3,in_stack_ffffffffffffffe8),
                       (int)((ulong)in_RDI >> 0x20));
    if (bVar1) break;
    cVar2 = val(in_RDI,iVar3);
    if (cVar2 == '\0') {
      search_assume_decision(in_RDI,in_stack_ffffffffffffffdc);
      bVar1 = propagate(in_stack_00000110);
      if (!bVar1) {
        iVar3 = unlucky(in_RDI,in_stack_ffffffffffffffdc);
        return iVar3;
      }
    }
    iVar3 = iVar3 + -1;
  }
  iVar3 = unlucky(in_RDI,in_stack_ffffffffffffffdc);
  return iVar3;
}

Assistant:

int Internal::backward_true_satisfiable () {
  LOG ("checking decreasing variable index true assignment");
  assert (!unsat);
  assert (!level);
  assert (assumptions.empty ());
  for (int idx = max_var; idx > 0; idx--) {
    if (terminated_asynchronously (10))
      return unlucky (-1);
    if (val (idx))
      continue;
    search_assume_decision (idx);
    if (!propagate ())
      return unlucky (0);
  }
  VERBOSE (1, "backward assuming variables true satisfies formula");
  assert (satisfied ());
  stats.lucky.backward.one++;
  return 10;
}